

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_close(uc_engine *uc)

{
  gpointer mem;
  ulong local_30;
  size_t i_1;
  MemoryRegion *mr;
  int i;
  uc_engine *uc_local;
  
  if ((uc->init_done & 1U) == 0) {
    free(uc);
  }
  else {
    if (uc->release != (uc_args_void_t)0x0) {
      (*uc->release)(uc->tcg_ctx);
    }
    g_free(uc->tcg_ctx);
    g_free(uc->cpu->cpu_ases);
    g_free(uc->cpu->thread);
    free(uc->cpu);
    g_hash_table_destroy(uc->flat_views);
    (*(uc->io_mem_unassigned).destructor)(&uc->io_mem_unassigned);
    (*uc->system_io->destructor)(uc->system_io);
    (*uc->system_memory->destructor)(uc->system_memory);
    g_free(uc->system_memory);
    g_free(uc->system_io);
    for (local_30 = 0; local_30 < uc->unmapped_regions->len; local_30 = local_30 + 1) {
      mem = *(gpointer *)(uc->unmapped_regions->data + local_30 * 8);
      (**(code **)((long)mem + 0x48))(mem);
      g_free(mem);
    }
    g_array_free(uc->unmapped_regions,1);
    if (uc->qemu_thread_data != (void *)0x0) {
      g_free(uc->qemu_thread_data);
    }
    g_free(uc->init_target_page);
    g_free(uc->l1_map);
    if ((uc->bounce).buffer != (void *)0x0) {
      free((uc->bounce).buffer);
    }
    clear_deleted_hooks(uc);
    for (mr._4_4_ = 0; mr._4_4_ < 0x12; mr._4_4_ = mr._4_4_ + 1) {
      list_clear(uc->hook + mr._4_4_);
    }
    free(uc->mapped_blocks);
    g_tree_destroy(uc->ctl_exits);
    memset(uc,0,0x3a10);
    free(uc);
  }
  return UC_ERR_OK;
}

Assistant:

UNICORN_EXPORT
uc_err uc_close(uc_engine *uc)
{
    int i;
    MemoryRegion *mr;

    if (!uc->init_done) {
        free(uc);
        return UC_ERR_OK;
    }

    // Cleanup internally.
    if (uc->release) {
        uc->release(uc->tcg_ctx);
    }
    g_free(uc->tcg_ctx);

    // Cleanup CPU.
    g_free(uc->cpu->cpu_ases);
    g_free(uc->cpu->thread);

    /* cpu */
    free(uc->cpu);

    /* flatviews */
    g_hash_table_destroy(uc->flat_views);

    // During flatviews destruction, we may still access memory regions.
    // So we free them afterwards.
    /* memory */
    mr = &uc->io_mem_unassigned;
    mr->destructor(mr);
    mr = uc->system_io;
    mr->destructor(mr);
    mr = uc->system_memory;
    mr->destructor(mr);
    g_free(uc->system_memory);
    g_free(uc->system_io);
    for (size_t i = 0; i < uc->unmapped_regions->len; i++) {
        mr = g_array_index(uc->unmapped_regions, MemoryRegion *, i);
        mr->destructor(mr);
        g_free(mr);
    }
    g_array_free(uc->unmapped_regions, true);

    // Thread relateds.
    if (uc->qemu_thread_data) {
        g_free(uc->qemu_thread_data);
    }

    /* free */
    g_free(uc->init_target_page);

    // Other auxilaries.
    g_free(uc->l1_map);

    if (uc->bounce.buffer) {
        free(uc->bounce.buffer);
    }

    // free hooks and hook lists
    clear_deleted_hooks(uc);

    for (i = 0; i < UC_HOOK_MAX; i++) {
        list_clear(&uc->hook[i]);
    }

    free(uc->mapped_blocks);

    g_tree_destroy(uc->ctl_exits);

    // finally, free uc itself.
    memset(uc, 0, sizeof(*uc));
    free(uc);

    return UC_ERR_OK;
}